

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_UsePuzzleItem(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  AInventory *pAVar1;
  int iVar2;
  AInventory *pAVar3;
  undefined4 extraout_var;
  PClass *pPVar5;
  PClass *pPVar6;
  undefined7 in_register_00000011;
  undefined8 uVar7;
  undefined8 extraout_RDX;
  AActor *pAVar8;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 *paVar9;
  bool bVar10;
  FSoundID local_2c;
  PClass *pPVar4;
  
  uVar7 = CONCAT71(in_register_00000011,backSide);
  if (it != (AActor *)0x0) {
    pAVar1 = (it->Inventory).field_0.p;
    if (pAVar1 != (AInventory *)0x0) {
      pPVar5 = APuzzleItem::RegistrationInfo.MyClass;
      pAVar8 = it;
      if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        do {
          pAVar3 = pAVar1;
          pPVar4 = (pAVar3->super_AActor).super_DThinker.super_DObject.Class;
          pPVar6 = pPVar5;
          if (pPVar4 == (PClass *)0x0) {
            iVar2 = (**(pAVar3->super_AActor).super_DThinker.super_DObject._vptr_DObject)
                              (pAVar3,pAVar8,uVar7);
            pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
            (pAVar3->super_AActor).super_DThinker.super_DObject.Class = pPVar4;
            pPVar6 = APuzzleItem::RegistrationInfo.MyClass;
            uVar7 = extraout_RDX;
          }
          bVar10 = pPVar4 == (PClass *)0x0;
          uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),!bVar10);
          if (pPVar4 != pPVar5 && !bVar10) {
            do {
              pPVar4 = pPVar4->ParentClass;
              uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),pPVar4 != (PClass *)0x0);
              if (pPVar4 == pPVar5) break;
            } while (pPVar4 != (PClass *)0x0);
          }
          if (((char)uVar7 != '\0') && (*(int *)&pAVar3->field_0x4fc == arg0)) {
            iVar2 = (*(it->super_DThinker).super_DObject._vptr_DObject[0x17])(it,pAVar3);
            if ((char)iVar2 != '\0') {
              return 1;
            }
            goto LAB_00406080;
          }
          pAVar1 = (pAVar3->super_AActor).Inventory.field_0.p;
          if (pAVar1 == (AInventory *)0x0) goto LAB_00406080;
          pPVar5 = pPVar6;
          pAVar8 = (AActor *)CONCAT71((int7)((ulong)pAVar8 >> 8),bVar10);
        } while (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0);
        paVar9 = &(pAVar3->super_AActor).Inventory.field_0;
      }
      else {
        paVar9 = &(it->Inventory).field_0;
      }
      paVar9->p = (AInventory *)0x0;
    }
LAB_00406080:
    local_2c.ID = S_FindSound("*puzzfail");
    S_Sound(it,2,&local_2c,1.0,1.001);
  }
  return 0;
}

Assistant:

FUNC(LS_UsePuzzleItem)
// UsePuzzleItem (item, script)
{
	AInventory *item;

	if (!it) return false;

	// Check player's inventory for puzzle item
	for (item = it->Inventory; item != NULL; item = item->Inventory)
	{
		if (item->IsKindOf (RUNTIME_CLASS(APuzzleItem)))
		{
			if (static_cast<APuzzleItem*>(item)->PuzzleItemNumber == arg0)
			{
				if (it->UseInventory (item))
				{
					return true;
				}
				break;
			}
		}
	}

	// [RH] Say "hmm" if you don't have the puzzle item
	S_Sound (it, CHAN_VOICE, "*puzzfail", 1, ATTN_IDLE);
	return false;
}